

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::FormattingScene::Option(FormattingScene *this,string *name,string *value,FileLoc loc)

{
  int iVar1;
  string nName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  anon_unknown_167::normalizeArg
            (&local_40,(anon_unknown_167 *)(name->_M_dataplus)._M_p,(string *)name->_M_string_length
            );
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 != 0) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_60,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc)
      ;
      Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ("%sOption \"%s\" %s\n",&local_60,name,value);
      goto LAB_0024fdea;
    }
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_60,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ("%sOption \"%s\" \"%s\"\n",&local_60,name,value);
LAB_0024fdea:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::Option(const std::string &name, const std::string &value,
                             FileLoc loc) {
    std::string nName = normalizeArg(name);
    if (nName == "msereferenceimage" || nName == "msereferenceout")
        Printf("%sOption \"%s\" \"%s\"\n", indent(), name, value);
    else
        Printf("%sOption \"%s\" %s\n", indent(), name, value);
}